

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Toplex_map.h
# Opt level: O2

bool __thiscall
Gudhi::Toplex_map::
maximality<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
          (Toplex_map *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *vertex_range
          )

{
  size_type sVar1;
  _Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  size_type sVar2;
  bool bVar3;
  Vertex local_30;
  Gudhi local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_30 = best_index<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                       (this,vertex_range);
  sVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)this,&local_30);
  if (sVar1 == 0) {
    bVar3 = false;
  }
  else {
    this_00 = &std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)this,&local_30)->_M_h;
    get_key<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
              (local_28,vertex_range);
    sVar2 = std::
            _Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(this_00,(key_type *)local_28);
    bVar3 = sVar2 != 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  }
  return bVar3;
}

Assistant:

bool Toplex_map::maximality(const Input_vertex_range& vertex_range) const {
  const Vertex& v = best_index(vertex_range);
  if (!t0.count(v)) return false;
  return t0.at(v).count(get_key(vertex_range));
}